

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t _elemsize;
  void *pvVar7;
  float *pfVar8;
  void *pvVar9;
  void *pvVar10;
  int k_1;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int i_3;
  long lVar20;
  int iVar21;
  size_type __n;
  int iVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  int k;
  ulong uVar27;
  int q;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  int j;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  float fVar35;
  undefined1 auVar36 [16];
  float fVar37;
  Mat m;
  Mat top_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  
  iVar22 = bottom_blob->c;
  iVar28 = -100;
  if ((iVar22 % this->group == 0) && (iVar15 = this->num_output, iVar15 % this->group == 0)) {
    uVar4 = bottom_blob->w;
    uVar34 = bottom_blob->h;
    uVar19 = (ulong)uVar34;
    iVar28 = this->kernel_w;
    iVar25 = this->dilation_w;
    _elemsize = bottom_blob->elemsize;
    iVar31 = this->stride_w;
    iVar17 = this->kernel_h;
    iVar18 = this->dilation_h;
    iVar21 = this->stride_h;
    iVar5 = this->output_pad_right;
    iVar6 = this->output_pad_bottom;
    top_blob_bordered.cstep = 0;
    top_blob_bordered.data = (void *)0x0;
    top_blob_bordered.refcount._0_4_ = 0;
    top_blob_bordered.refcount._4_4_ = 0;
    top_blob_bordered._16_12_ = SUB1612((undefined1  [16])0x0,4);
    top_blob_bordered._32_12_ = SUB1612((undefined1  [16])0x0,0);
    top_blob_bordered.w = 0;
    top_blob_bordered.h = 0;
    top_blob_bordered.d = 0;
    top_blob_bordered.c = 0;
    auVar36._0_4_ = -(uint)(0 < this->pad_left);
    auVar36._4_4_ = -(uint)(0 < this->pad_right);
    auVar36._8_4_ = -(uint)(0 < this->pad_top);
    auVar36._12_4_ = -(uint)(0 < this->pad_bottom);
    iVar16 = movmskps(uVar34,auVar36);
    lVar23 = 0x10;
    if ((iVar16 == 0) && ((this->output_w < 1 || (this->output_h < 1)))) {
      Mat::operator=(&top_blob_bordered,top_blob);
      iVar15 = this->num_output;
      lVar23 = 8;
    }
    iVar31 = (iVar28 + -1) * iVar25 + (uVar4 - 1) * iVar31 + iVar5 + 1;
    iVar25 = iVar6 + 1 + (iVar17 + -1) * iVar18 + (uVar34 - 1) * iVar21;
    Mat::create(&top_blob_bordered,iVar31,iVar25,iVar15,_elemsize,
                *(Allocator **)(&opt->lightmode + lVar23));
    iVar28 = -100;
    if ((top_blob_bordered.data != (void *)0x0) &&
       ((long)top_blob_bordered.c * top_blob_bordered.cstep != 0)) {
      uVar11 = this->kernel_w * this->kernel_h;
      __n = (size_type)(int)uVar11;
      std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&m);
      iVar28 = this->dilation_h;
      iVar15 = this->kernel_w;
      iVar17 = this->dilation_w * iVar15;
      iVar21 = 0;
      lVar23 = 0;
      for (iVar18 = 0; iVar18 < this->kernel_h; iVar18 = iVar18 + 1) {
        for (lVar26 = 0; (int)lVar26 < iVar15; lVar26 = lVar26 + 1) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(int)lVar23 + lVar26] = iVar21;
          iVar21 = iVar21 + this->dilation_w;
          iVar15 = this->kernel_w;
        }
        iVar21 = iVar21 + (iVar28 * iVar31 - iVar17);
        lVar23 = (int)lVar23 + lVar26;
      }
      iVar28 = this->group;
      if (iVar28 == this->num_output && iVar22 == iVar28) {
        uVar30 = 0;
        if (0 < (int)uVar11) {
          uVar30 = (ulong)uVar11;
        }
        uVar29 = 0;
        if (0 < (int)uVar4) {
          uVar29 = (ulong)uVar4;
        }
        if ((int)uVar34 < 1) {
          uVar19 = 0;
        }
        lVar23 = 0;
        uVar34 = iVar25 * iVar31;
        if (iVar25 * iVar31 < 1) {
          uVar34 = 0;
        }
        uVar32 = (ulong)uVar34;
        for (lVar26 = 0; lVar26 < iVar22; lVar26 = lVar26 + 1) {
          Mat::channel(&m,bottom_blob,(int)lVar26);
          pvVar9 = m.data;
          Mat::~Mat(&m);
          pvVar7 = (this->weight_data).data;
          Mat::channel(&m,&top_blob_bordered,(int)lVar26);
          if (this->bias_term == 0) {
            fVar35 = 0.0;
          }
          else {
            fVar35 = *(float *)((long)(this->bias_data).data + lVar26 * 4);
          }
          Mat::fill(&m,fVar35);
          pvVar10 = m.data;
          for (uVar13 = 0; uVar13 != uVar19; uVar13 = uVar13 + 1) {
            iVar22 = this->stride_h;
            iVar28 = this->stride_w;
            for (uVar24 = 0; uVar24 != uVar29; uVar24 = uVar24 + 1) {
              lVar1 = uVar24 * (long)iVar28 * 4 + (long)m.w * (long)iVar22 * uVar13 * m.elemsize;
              for (uVar27 = 0; uVar30 != uVar27; uVar27 = uVar27 + 1) {
                *(float *)((long)m.data +
                          (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar27] * 4 + lVar1) =
                     *(float *)((long)pvVar7 + uVar27 * 4 + lVar23) *
                     *(float *)((long)pvVar9 + uVar24 * 4 + uVar13 * (long)(int)uVar4 * 4) +
                     *(float *)((long)m.data +
                               (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar27] * 4 + lVar1);
              }
            }
          }
          switch(this->activation_type) {
          case 1:
            for (uVar13 = 0; uVar32 != uVar13; uVar13 = uVar13 + 1) {
              fVar35 = *(float *)((long)m.data + uVar13 * 4);
              if (fVar35 <= 0.0) {
                fVar35 = 0.0;
              }
              *(float *)((long)m.data + uVar13 * 4) = fVar35;
            }
            break;
          case 2:
            uVar34 = *(this->activation_params).data;
            for (uVar13 = 0; uVar32 != uVar13; uVar13 = uVar13 + 1) {
              fVar35 = *(float *)((long)m.data + uVar13 * 4);
              uVar11 = -(uint)(0.0 < fVar35);
              *(float *)((long)m.data + uVar13 * 4) =
                   (float)(~uVar11 & uVar34 | uVar11 & 0x3f800000) * fVar35;
            }
            break;
          case 3:
            pfVar8 = (float *)(this->activation_params).data;
            fVar35 = *pfVar8;
            fVar2 = pfVar8[1];
            for (uVar13 = 0; uVar32 != uVar13; uVar13 = uVar13 + 1) {
              fVar3 = *(float *)((long)m.data + uVar13 * 4);
              fVar37 = fVar3;
              if (fVar3 <= fVar35) {
                fVar37 = fVar35;
              }
              if ((fVar3 < fVar35) || (fVar2 < fVar37)) {
                if (fVar2 <= fVar37) {
                  fVar37 = fVar2;
                }
                *(float *)((long)m.data + uVar13 * 4) = fVar37;
              }
            }
            break;
          case 4:
            for (uVar13 = 0; uVar32 != uVar13; uVar13 = uVar13 + 1) {
              fVar35 = expf(-*(float *)((long)pvVar10 + uVar13 * 4));
              *(float *)((long)pvVar10 + uVar13 * 4) = 1.0 / (fVar35 + 1.0);
            }
          }
          Mat::~Mat(&m);
          iVar22 = this->group;
          lVar23 = lVar23 + __n * 4;
        }
      }
      else {
        iVar22 = iVar22 / iVar28;
        uVar12 = this->num_output / iVar28;
        uVar30 = 0;
        uVar29 = 0;
        if (0 < (int)uVar11) {
          uVar29 = (ulong)uVar11;
        }
        iVar15 = 0;
        if (0 < iVar22) {
          iVar15 = iVar22;
        }
        uVar32 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar32 = uVar30;
        }
        if ((int)uVar34 < 1) {
          uVar19 = uVar30;
        }
        uVar13 = 0;
        if (0 < (int)uVar12) {
          uVar13 = (ulong)uVar12;
        }
        iVar17 = 0;
        uVar24 = (ulong)(uint)(iVar25 * iVar31);
        if (iVar25 * iVar31 < 1) {
          uVar24 = uVar30;
        }
        for (lVar23 = 0; lVar23 < iVar28; lVar23 = lVar23 + 1) {
          lVar26 = (long)iVar17 << 2;
          for (uVar30 = 0; uVar30 != uVar13; uVar30 = uVar30 + 1) {
            lVar1 = uVar30 + lVar23 * (int)uVar12;
            Mat::channel(&m,&top_blob_bordered,(int)lVar1);
            if (this->bias_term == 0) {
              fVar35 = 0.0;
            }
            else {
              fVar35 = *(float *)((long)(this->bias_data).data + lVar1 * 4);
            }
            pvVar7 = (this->weight_data).data;
            Mat::fill(&m,fVar35);
            for (uVar27 = 0; pvVar9 = m.data, uVar27 != uVar19; uVar27 = uVar27 + 1) {
              for (uVar33 = 0; pvVar9 = m.data, uVar33 != uVar32; uVar33 = uVar33 + 1) {
                lVar1 = (long)(int)uVar33 * (long)this->stride_w * 4 +
                        (long)m.w * (long)this->stride_h * (long)(int)uVar27 * m.elemsize;
                lVar20 = (long)pvVar7 + lVar26;
                for (iVar28 = 0; iVar28 != iVar15; iVar28 = iVar28 + 1) {
                  Mat::channel(&m_1,bottom_blob,iVar28 + iVar22 * (int)lVar23);
                  fVar35 = *(float *)((long)m_1.data +
                                     uVar33 * 4 + (long)m_1.w * uVar27 * m_1.elemsize);
                  for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
                    *(float *)((long)pvVar9 +
                              (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_start[uVar14] * 4 + lVar1) =
                         *(float *)(lVar20 + uVar14 * 4) * fVar35 +
                         *(float *)((long)pvVar9 +
                                   (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[uVar14] * 4 +
                                   lVar1);
                  }
                  Mat::~Mat(&m_1);
                  lVar20 = lVar20 + __n * 4;
                }
              }
            }
            switch(this->activation_type) {
            case 1:
              for (uVar27 = 0; uVar24 != uVar27; uVar27 = uVar27 + 1) {
                fVar35 = *(float *)((long)m.data + uVar27 * 4);
                if (fVar35 <= 0.0) {
                  fVar35 = 0.0;
                }
                *(float *)((long)m.data + uVar27 * 4) = fVar35;
              }
              break;
            case 2:
              uVar4 = *(this->activation_params).data;
              for (uVar27 = 0; uVar24 != uVar27; uVar27 = uVar27 + 1) {
                fVar35 = *(float *)((long)m.data + uVar27 * 4);
                uVar34 = -(uint)(0.0 < fVar35);
                *(float *)((long)m.data + uVar27 * 4) =
                     (float)(~uVar34 & uVar4 | uVar34 & 0x3f800000) * fVar35;
              }
              break;
            case 3:
              pfVar8 = (float *)(this->activation_params).data;
              fVar35 = *pfVar8;
              fVar2 = pfVar8[1];
              for (uVar27 = 0; uVar24 != uVar27; uVar27 = uVar27 + 1) {
                fVar3 = *(float *)((long)m.data + uVar27 * 4);
                fVar37 = fVar3;
                if (fVar3 <= fVar35) {
                  fVar37 = fVar35;
                }
                if ((fVar3 < fVar35) || (fVar2 < fVar37)) {
                  if (fVar2 <= fVar37) {
                    fVar37 = fVar2;
                  }
                  *(float *)((long)m.data + uVar27 * 4) = fVar37;
                }
              }
              break;
            case 4:
              for (uVar27 = 0; uVar24 != uVar27; uVar27 = uVar27 + 1) {
                fVar35 = expf(-*(float *)((long)pvVar9 + uVar27 * 4));
                *(float *)((long)pvVar9 + uVar27 * 4) = 1.0 / (fVar35 + 1.0);
              }
            }
            Mat::~Mat(&m);
            lVar26 = lVar26 + (long)(int)(iVar22 * uVar11) * 4;
          }
          iVar28 = this->group;
          iVar17 = iVar17 + uVar12 * iVar22 * uVar11;
        }
      }
      cut_padding(this,&top_blob_bordered,top_blob,opt);
      if ((top_blob->data == (void *)0x0) || (iVar28 = 0, (long)top_blob->c * top_blob->cstep == 0))
      {
        iVar28 = -100;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    }
    Mat::~Mat(&top_blob_bordered);
  }
  return iVar28;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat m = top_blob_bordered.channel(g);

            const float bias = bias_term ? bias_data[g] : 0.f;

            m.fill(bias);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = inptr[i * w + j];
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }
                }
            }

            if (activation_type == 1)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], 0.f);
                }
            }
            else if (activation_type == 2)
            {
                float* outptr = m;
                int size = outw * outh;
                float slope = activation_params[0];

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                }
            }
            else if (activation_type == 3)
            {
                float* outptr = m;
                int size = outw * outh;
                float min = activation_params[0];
                float max = activation_params[1];

                for (int i = 0; i < size; i++)
                {
                    if (outptr[i] < min)
                        outptr[i] = min;
                    if (outptr[i] > max)
                        outptr[i] = max;
                }
            }
            else if (activation_type == 4)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                }
            }
        }
    }
    else
    {
        // num_output
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                Mat out = top_blob_bordered.channel(g * num_output_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;
                const float bias = bias_term ? bias_data[g * num_output_g + p] : 0.f;

                out.fill(bias);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i * stride_h) + j * stride_w;

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob.channel(channels_g * g + q);
                            float val = *(m.row(i) + j);

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[space_ofs[k]] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }

                if (activation_type == 1)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = std::max(outptr[i], 0.f);
                    }
                }
                else if (activation_type == 2)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float slope = activation_params[0];

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                    }
                }
                else if (activation_type == 3)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float min = activation_params[0];
                    float max = activation_params[1];

                    for (int i = 0; i < size; i++)
                    {
                        if (outptr[i] < min)
                            outptr[i] = min;
                        if (outptr[i] > max)
                            outptr[i] = max;
                    }
                }
                else if (activation_type == 4)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                    }
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}